

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

int new_value(json_state *state,json_value **top,json_value **root,json_value **alloc,json_type type
             )

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int values_size;
  json_value *value;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  json_state *in_stack_ffffffffffffffc8;
  json_state *state_00;
  int local_4;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    state_00 = (json_state *)*in_RCX;
    *in_RSI = state_00;
    *in_RCX = *(long *)(*in_RCX + 0x20);
    if (*in_RDX == 0) {
      *in_RDX = (long)state_00;
    }
    uVar1 = state_00->uint_max;
    if (uVar1 == 1) {
      if ((int)state_00->ulong_max != 0) {
        iVar2 = (int)state_00->ulong_max * 0x18;
        pvVar3 = json_alloc(state_00,CONCAT44(iVar2,1),in_stack_ffffffffffffffbc);
        (state_00->settings).max_memory = (unsigned_long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          return 0;
        }
        *(unsigned_long *)&(state_00->settings).settings =
             (state_00->settings).max_memory + (long)iVar2;
        *(undefined4 *)&state_00->ulong_max = 0;
      }
    }
    else if (uVar1 == 2) {
      if ((int)state_00->ulong_max != 0) {
        pvVar3 = json_alloc(state_00,CONCAT44(in_stack_ffffffffffffffc4,2),in_stack_ffffffffffffffbc
                           );
        (state_00->settings).max_memory = (unsigned_long)pvVar3;
        if (pvVar3 == (void *)0x0) {
          return 0;
        }
        *(undefined4 *)&state_00->ulong_max = 0;
      }
    }
    else if (uVar1 == 5) {
      pvVar3 = json_alloc(state_00,CONCAT44(in_stack_ffffffffffffffc4,5),in_stack_ffffffffffffffbc);
      (state_00->settings).max_memory = (unsigned_long)pvVar3;
      if (pvVar3 == (void *)0x0) {
        return 0;
      }
      *(undefined4 *)&state_00->ulong_max = 0;
    }
    local_4 = 1;
  }
  else {
    puVar4 = (undefined8 *)
             json_alloc(in_stack_ffffffffffffffc8,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    if (puVar4 == (undefined8 *)0x0) {
      local_4 = 0;
    }
    else {
      if (*in_RDX == 0) {
        *in_RDX = (long)puVar4;
      }
      *(undefined4 *)(puVar4 + 1) = in_R8D;
      *puVar4 = *in_RSI;
      if (*in_RCX != 0) {
        *(undefined8 **)(*in_RCX + 0x20) = puVar4;
      }
      *in_RSI = puVar4;
      *in_RCX = (long)puVar4;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int new_value (json_state * state,
                      json_value ** top, json_value ** root, json_value ** alloc,
                      json_type type)
{
   json_value * value;
   int values_size;

   if (!state->first_pass)
   {
      value = *top = *alloc;
      *alloc = (*alloc)->_reserved.next_alloc;

      if (!*root)
         *root = value;

      switch (value->type)
      {
         case json_array:

            if (value->u.array.length == 0)
               break;

            if (! (value->u.array.values = (json_value **) json_alloc
               (state, value->u.array.length * sizeof (json_value *), 0)) )
            {
               return 0;
            }

            value->u.array.length = 0;
            break;

         case json_object:

            if (value->u.object.length == 0)
               break;

            values_size = sizeof (*value->u.object.values) * value->u.object.length;

            if (! (value->u.object.values = (json_object_entry *) json_alloc
                  (state, values_size + ((unsigned long) value->u.object.values), 0)) )
            {
               return 0;
            }

            value->_reserved.object_mem = (*(char **) &value->u.object.values) + values_size;

            value->u.object.length = 0;
            break;

         case json_string:

            if (! (value->u.string.ptr = (json_char *) json_alloc
               (state, (value->u.string.length + 1) * sizeof (json_char), 0)) )
            {
               return 0;
            }

            value->u.string.length = 0;
            break;

         default:
            break;
      };

      return 1;
   }

   if (! (value = (json_value *) json_alloc
         (state, sizeof (json_value) + state->settings.value_extra, 1)))
   {
      return 0;
   }

   if (!*root)
      *root = value;

   value->type = type;
   value->parent = *top;

   #ifdef JSON_TRACK_SOURCE
      value->line = state->cur_line;
      value->col = state->cur_col;
   #endif

   if (*alloc)
      (*alloc)->_reserved.next_alloc = value;

   *alloc = *top = value;

   return 1;
}